

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::directiveList(GrpParser *this)

{
  ASTFactory *this_00;
  ASTFactory *this_01;
  uint uVar1;
  int iVar2;
  RefAST RVar3;
  NoViableAltException *pNVar4;
  RefAST tmp24_AST;
  RefAST directiveList_AST;
  ASTPair currentAST;
  RefAST tmp21_AST;
  undefined1 local_b0 [16];
  RefCount<AST> local_a0;
  ASTPair local_98;
  RefAST *local_80;
  RefCount<Token> local_78;
  RefCount<Token> local_70;
  RefCount<Token> local_68;
  RefCount<AST> local_60;
  RefToken local_58;
  RefToken local_50;
  RefCount<AST> local_48;
  RefAST local_40;
  RefCount<Token> local_38;
  
  local_80 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(local_80,&nullAST);
  local_a0.ref = nullAST.ref;
  local_98.root.ref = (Ref *)0x0;
  local_98.child.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_a0.ref = (Ref *)0x0;
  }
  else {
    uVar1 = (nullAST.ref)->count;
    (nullAST.ref)->count = uVar1 + 1;
    (local_a0.ref)->count = uVar1 + 2;
  }
  local_60.ref = local_a0.ref;
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_68,this,1);
  this_00 = &(this->super_LLkParser).super_Parser.astFactory;
  ASTFactory::create((ASTFactory *)local_b0,(RefToken *)this_00);
  RefCount<AST>::operator=(&local_60,(RefCount<AST> *)local_b0);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_b0);
  RefCount<Token>::~RefCount(&local_68);
  Parser::match((Parser *)this,0xb);
  iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar2 != 0xc) {
    if (iVar2 != 0xd) {
      pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_58,this,1);
      NoViableAltException::NoViableAltException(pNVar4,&local_58);
      __cxa_throw(pNVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    directive(this);
    local_40.ref = local_80->ref;
    if (local_40.ref == (Ref *)0x0) {
      local_40.ref = (Ref *)0x0;
    }
    else {
      (local_40.ref)->count = (local_40.ref)->count + 1;
    }
    ASTFactory::addASTChild(this_00,&local_98,&local_40);
    RefCount<AST>::~RefCount(&local_40);
    this_01 = (ASTFactory *)(local_b0 + 8);
    while( true ) {
      iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      if (iVar2 != 8) break;
      iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      if (iVar2 != 0xd) break;
      iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
      RVar3 = nullAST;
      if (iVar2 != 4) break;
      if (nullAST.ref == (Ref *)0x0) {
        RVar3.ref = (Ref *)0x0;
      }
      else {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      local_b0._0_8_ = RVar3.ref;
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_38,this,1);
      ASTFactory::create(this_01,(RefToken *)this_00);
      RefCount<AST>::operator=((RefCount<AST> *)local_b0,(RefCount<AST> *)this_01);
      RefCount<AST>::~RefCount((RefCount<AST> *)this_01);
      RefCount<Token>::~RefCount(&local_38);
      Parser::match((Parser *)this,8);
      directive(this);
      local_48.ref = local_80->ref;
      if (local_48.ref == (Ref *)0x0) {
        local_48.ref = (Ref *)0x0;
      }
      else {
        (local_48.ref)->count = (local_48.ref)->count + 1;
      }
      ASTFactory::addASTChild(this_00,&local_98,&local_48);
      RefCount<AST>::~RefCount(&local_48);
      RefCount<AST>::~RefCount((RefCount<AST> *)local_b0);
    }
    iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    RVar3 = nullAST;
    if (iVar2 != 0xc) {
      if (iVar2 != 8) {
        pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_50,this,1);
        NoViableAltException::NoViableAltException(pNVar4,&local_50);
        __cxa_throw(pNVar4,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      if (nullAST.ref == (Ref *)0x0) {
        RVar3.ref = (Ref *)0x0;
      }
      else {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      local_b0._0_8_ = RVar3.ref;
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_70,this,1);
      ASTFactory::create((ASTFactory *)(local_b0 + 8),(RefToken *)this_00);
      RefCount<AST>::operator=((RefCount<AST> *)local_b0,(RefCount<AST> *)(local_b0 + 8));
      RefCount<AST>::~RefCount((RefCount<AST> *)(local_b0 + 8));
      RefCount<Token>::~RefCount(&local_70);
      Parser::match((Parser *)this,8);
      RefCount<AST>::~RefCount((RefCount<AST> *)local_b0);
    }
  }
  local_b0._0_8_ = nullAST.ref;
  if (nullAST.ref == (Ref *)0x0) {
    local_b0._0_8_ = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
  ASTFactory::create((ASTFactory *)(local_b0 + 8),(RefToken *)this_00);
  RefCount<AST>::operator=((RefCount<AST> *)local_b0,(RefCount<AST> *)(local_b0 + 8));
  RefCount<AST>::~RefCount((RefCount<AST> *)(local_b0 + 8));
  RefCount<Token>::~RefCount(&local_78);
  Parser::match((Parser *)this,0xc);
  RefCount<AST>::operator=(&local_a0,&local_98.root);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_b0);
  RefCount<AST>::~RefCount(&local_60);
  RefCount<AST>::operator=(local_80,&local_a0);
  RefCount<AST>::~RefCount(&local_a0);
  RefCount<AST>::~RefCount(&local_98.child);
  RefCount<AST>::~RefCount(&local_98.root);
  return;
}

Assistant:

void GrpParser::directiveList() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST directiveList_AST = nullAST;
	
	try {      // for error handling
		RefAST tmp21_AST = nullAST;
		tmp21_AST = astFactory.create(LT(1));
		match(OP_LBRACE);
		{
		switch ( LA(1)) {
		case IDENT:
		{
			directive();
			astFactory.addASTChild(currentAST, returnAST);
			{
			do {
				if ((LA(1)==OP_SEMI) && (LA(2)==IDENT) && (LA(3)==OP_EQ)) {
					RefAST tmp22_AST = nullAST;
					tmp22_AST = astFactory.create(LT(1));
					match(OP_SEMI);
					directive();
					astFactory.addASTChild(currentAST, returnAST);
				}
				else {
					goto _loop20;
				}
				
			} while (true);
			_loop20:;
			}
			{
			switch ( LA(1)) {
			case OP_SEMI:
			{
				RefAST tmp23_AST = nullAST;
				tmp23_AST = astFactory.create(LT(1));
				match(OP_SEMI);
				break;
			}
			case OP_RBRACE:
			{
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
			break;
		}
		case OP_RBRACE:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		RefAST tmp24_AST = nullAST;
		tmp24_AST = astFactory.create(LT(1));
		match(OP_RBRACE);
		directiveList_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_9);
	}
	returnAST = directiveList_AST;
}